

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00e2.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  istream *piVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  undefined8 uStack_80;
  int aiStack_78 [2];
  long local_70;
  int *local_68;
  undefined1 *local_60;
  int local_58;
  int local_54;
  int r1;
  int c1;
  uint local_44;
  int local_40;
  int x;
  int r;
  int r2;
  int c2;
  int y;
  
  uStack_80 = 0x101203;
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_44);
  uStack_80 = 0x101212;
  std::istream::operator>>(piVar4,&r2);
  uStack_80 = 0x10121e;
  std::istream::operator>>((istream *)&std::cin,&local_40);
  _r1 = (ulong)(uint)r2;
  lVar3 = -(local_44 * _r1 * 4 + 0xf & 0xfffffffffffffff0);
  piVar13 = (int *)((long)aiStack_78 + lVar3);
  local_68 = piVar13;
  local_60 = (undefined1 *)aiStack_78;
  if (0 < (int)local_44) {
    uVar5 = (ulong)(uint)r2;
    local_70 = _r1 * 4;
    lVar12 = 0;
    uVar6 = local_44;
    local_60 = (undefined1 *)aiStack_78;
    do {
      if (0 < (int)uVar5) {
        lVar16 = 0;
        piVar14 = piVar13;
        do {
          *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101280;
          std::istream::operator>>((istream *)&std::cin,piVar14);
          lVar16 = lVar16 + 1;
          uVar5 = (ulong)r2;
          piVar14 = piVar14 + 1;
          uVar6 = local_44;
        } while (lVar16 < (long)uVar5);
      }
      lVar12 = lVar12 + 1;
      piVar13 = (int *)((long)piVar13 + local_70);
    } while (lVar12 < (int)uVar6);
  }
  if (0 < local_40) {
    lVar12 = _r1 * 4;
    iVar15 = 0;
    do {
      *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x1012da;
      piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_58);
      *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x1012e6;
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_54);
      *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x1012f1;
      piVar4 = (istream *)std::istream::operator>>(piVar4,&x);
      *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x1012fc;
      std::istream::operator>>(piVar4,&r);
      if ((x < local_58) || (r < local_54)) {
        lVar16 = 8;
        poVar9 = (ostream *)&std::cout;
        pcVar8 = "INVALID\n";
LAB_00101321:
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101326;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar8,lVar16);
      }
      else {
        if (local_54 <= r2 && local_58 <= (int)local_44) {
          if ((int)local_44 < x) {
            x = local_44;
          }
          if (r2 < r) {
            r = r2;
          }
          lVar16 = (long)local_58 + -1;
          iVar7 = local_68[lVar16 * _r1 + (long)local_54 + -1];
          if (local_58 <= x) {
            lVar10 = lVar12 * lVar16 + (long)(local_54 + -1) * 4 + (long)local_68;
            do {
              if (local_54 <= r) {
                lVar11 = 0;
                do {
                  iVar1 = *(int *)(lVar10 + lVar11 * 4);
                  if (iVar7 < iVar1) {
                    iVar7 = iVar1;
                  }
                  lVar11 = lVar11 + 1;
                } while ((r - local_54) + 1 != (int)lVar11);
              }
              lVar16 = lVar16 + 1;
              lVar10 = lVar10 + lVar12;
            } while (x != (int)lVar16);
          }
          *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x10140c;
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
          lVar16 = 1;
          pcVar8 = "\n";
          goto LAB_00101321;
        }
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101365;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OUTSIDE",7);
        uVar2 = *(undefined8 *)(std::cout + -0x18);
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101379;
        std::ios::widen((char)uVar2 + '8');
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x101384;
        std::ostream::put('8');
        *(undefined8 *)((long)aiStack_78 + lVar3 + -8) = 0x10138c;
        std::ostream::flush();
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < local_40);
  }
  return 0;
}

Assistant:

int main() {
    int x, y;
    cin >> x >> y;
    int r, r1, c1, r2, c2;
    cin >> r;
    int arr[x][y];
    for (int i = 0; i < x; i++) {
        for (int j = 0; j < y; j++) {
            cin >> arr[i][j];
        }
    }

    for (int i = 0; i < r; i++) {
        cin >> r1 >> c1 >> r2 >> c2;
        if (r1 > r2 || c1 > c2) {
            cout << "INVALID\n";
        } else if (r1 > x || c1 > y) {
            cout << "OUTSIDE" << endl;
        } else {
            if (r2 > x)
                r2 = x;
            if (c2 > y)
                c2 = y;
            int localmax = arr[r1 - 1][c1 - 1];
            for (int i = r1 - 1; i < r2; i++) {
                for (int j = c1 - 1; j < c2; j++) {
                    if (arr[i][j] > localmax) {
                        localmax = arr[i][j];
                    }
                }
            }
            cout << localmax << "\n";
        }
    }
}